

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_file_tests.cpp
# Opt level: O0

void __thiscall
iu_StdFileUnitTest_x_iutest_x_FileSizeFromPath_Test::Body
          (iu_StdFileUnitTest_x_iutest_x_FileSizeFromPath_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionHelper local_448;
  Fixed local_418;
  iu_uint_max_t local_290;
  undefined1 local_288 [8];
  AssertionResult iutest_ar_1;
  string local_258;
  AssertionHelper local_238;
  Fixed local_208;
  bool local_79;
  undefined1 local_78 [8];
  AssertionResult iutest_ar;
  undefined1 local_40 [8];
  FilePath file_path;
  char *path;
  iu_uint_max_t expectedSize;
  iu_StdFileUnitTest_x_iutest_x_FileSizeFromPath_Test *this_local;
  
  path = (char *)0x100000000;
  file_path.m_path.field_2._8_8_ = anon_var_dwarf_41038;
  expectedSize = (iu_uint_max_t)this;
  iutest::detail::iuFilePath::iuFilePath((iuFilePath *)local_40,"./testdata/4gb.bin");
  iutest::detail::AlwaysZero();
  local_79 = iutest::detail::iuFilePath::FileOrDirectoryExists((iuFilePath *)local_40);
  iutest::AssertionResult::Is<bool>((AssertionResult *)local_78,&local_79);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    memset(&local_208,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_208);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_258,(internal *)local_78,
               (AssertionResult *)"file_path.FileOrDirectoryExists()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
               ,0x7f,pcVar2,kAssumeFailure);
    iutest::AssertionHelper::operator=(&local_238,&local_208);
    iutest::AssertionHelper::~AssertionHelper(&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    iutest::AssertionHelper::Fixed::~Fixed(&local_208);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    local_290 = iutest::internal::posix::FileSizeFromPath((char *)file_path.m_path.field_2._8_8_);
    iutest::internal::backward::EqHelper<false>::Compare<unsigned_long>
              ((AssertionResult *)local_288,"expectedSize",
               "::iutest::internal::posix::FileSizeFromPath(path)",(unsigned_long *)&path,&local_290
              );
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
    if (!bVar1) {
      memset(&local_418,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_418);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_288);
      iutest::AssertionHelper::AssertionHelper
                (&local_448,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
                 ,0x80,pcVar2,kFatalFailure);
      iutest::AssertionHelper::operator=(&local_448,&local_418);
      iutest::AssertionHelper::~AssertionHelper(&local_448);
      iutest::AssertionHelper::Fixed::~Fixed(&local_418);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_288);
    if (iutest_ar_1._36_4_ == 0) {
      iutest_ar_1._36_4_ = 0;
    }
  }
  iutest::detail::iuFilePath::~iuFilePath((iuFilePath *)local_40);
  return;
}

Assistant:

IUTEST(StdFileUnitTest, FileSizeFromPath)
{
    const ::iutest::iu_uint_max_t expectedSize = 0x100000000ull;
    const char* path = "./testdata/4gb.bin";
    ::iutest::internal::FilePath file_path = ::iutest::internal::FilePath(path);
    IUTEST_ASSUME_TRUE (file_path.FileOrDirectoryExists());
    IUTEST_ASSERT_EQ(expectedSize, ::iutest::internal::posix::FileSizeFromPath(path));
}